

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testlab5.c
# Opt level: O0

int FeedCompressBig1(void)

{
  size_t sVar1;
  uint uVar2;
  int iVar3;
  uchar *__s;
  byte local_d;
  uchar c;
  
  InputLength = 0;
  local_d = 0;
  while( true ) {
    sVar1 = InputLength;
    if (AlphabetSize <= local_d) {
      iVar3 = FeedCompress();
      return iVar3;
    }
    uVar2 = CalcFib((uint)local_d);
    iVar3 = IsInputTooLarge(sVar1 + uVar2);
    if (iVar3 != 0) break;
    __s = Input + InputLength;
    uVar2 = CalcFib((uint)local_d);
    memset(__s,(uint)local_d,(ulong)uVar2);
    uVar2 = CalcFib((uint)local_d);
    InputLength = uVar2 + InputLength;
    local_d = local_d + 1;
  }
  return -1;
}

Assistant:

static int FeedCompressBig1(void) {
    InputLength = 0;
    for (unsigned char c = 0; c < AlphabetSize; ++c) {
        if (IsInputTooLarge(InputLength + CalcFib(c))) {
            return -1;
        }
        memset(Input + InputLength, c, CalcFib(c));
        InputLength += CalcFib(c);
    }
    return FeedCompress();
}